

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

_Bool sx_signal_wait(sx_signal *sig,int msecs)

{
  code *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 local_38 [7];
  _Bool ok;
  timespec ts;
  int r;
  sx__signal *_sig;
  int msecs_local;
  sx_signal *sig_local;
  
  ts.tv_nsec._4_4_ = pthread_mutex_lock((pthread_mutex_t *)sig);
  if (ts.tv_nsec._4_4_ != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x17f,"r == 0");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (msecs == -1) {
    ts.tv_nsec._4_4_ =
         pthread_cond_wait((pthread_cond_t *)(sig->data + 0x28),(pthread_mutex_t *)sig);
  }
  else {
    clock_gettime(0,(timespec *)local_38);
    sx__tm_add((timespec *)local_38,msecs);
    ts.tv_nsec._4_4_ =
         pthread_cond_timedwait
                   ((pthread_cond_t *)(sig->data + 0x28),(pthread_mutex_t *)sig,(timespec *)local_38
                   );
  }
  bVar3 = ts.tv_nsec._4_4_ == 0;
  if (bVar3) {
    sig->data[0x58] = '\0';
    sig->data[0x59] = '\0';
    sig->data[0x5a] = '\0';
    sig->data[0x5b] = '\0';
  }
  pthread_mutex_unlock((pthread_mutex_t *)sig);
  return bVar3;
}

Assistant:

bool sx_signal_wait(sx_signal* sig, int msecs)
{
    sx__signal* _sig = (sx__signal*)sig->data;
    int r = pthread_mutex_lock(&_sig->mutex);
    sx_assert(r == 0);

    if (msecs == -1) {
        r = pthread_cond_wait(&_sig->cond, &_sig->mutex);
    } else {
        struct timespec ts;
        clock_gettime(CLOCK_REALTIME, &ts);
        sx__tm_add(&ts, msecs);
        r = pthread_cond_timedwait(&_sig->cond, &_sig->mutex, &ts);
    }

    bool ok = r == 0;
    if (ok)
        _sig->value = 0;
    r = pthread_mutex_unlock(&_sig->mutex);
    sx_unused(r);
    return ok;
}